

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall
QGridLayoutPrivate::getItemPosition
          (QGridLayoutPrivate *this,int index,int *row,int *column,int *rowSpan,int *columnSpan)

{
  QGridBox *pQVar1;
  int iVar2;
  int iVar3;
  
  if ((-1 < index) && ((ulong)(uint)index < (ulong)(this->things).d.size)) {
    pQVar1 = (this->things).d.ptr[(uint)index];
    iVar2 = this->rr + -1;
    if (-1 < pQVar1->torow) {
      iVar2 = pQVar1->torow;
    }
    iVar3 = this->cc + -1;
    if (-1 < pQVar1->tocol) {
      iVar3 = pQVar1->tocol;
    }
    *row = pQVar1->row;
    *column = pQVar1->col;
    *rowSpan = (iVar2 - *row) + 1;
    *columnSpan = (iVar3 - *column) + 1;
  }
  return;
}

Assistant:

void getItemPosition(int index, int *row, int *column, int *rowSpan, int *columnSpan) const {
        if (index >= 0 && index < things.size()) {
            const QGridBox *b =  things.at(index);
            int toRow = b->toRow(rr);
            int toCol = b->toCol(cc);
            *row = b->row;
            *column = b->col;
            *rowSpan = toRow - *row + 1;
            *columnSpan = toCol - *column +1;
        }
    }